

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

HelicsMessage helicsEndpointCreateMessage(HelicsEndpoint endpoint,HelicsError *err)

{
  Message *pMVar1;
  
  if (err == (HelicsError *)0x0) {
    if (endpoint == (HelicsEndpoint)0x0) {
      return (HelicsMessage)0x0;
    }
    if (*(int *)((long)endpoint + 0x20) != -0x4bac6b3e) {
      return (HelicsMessage)0x0;
    }
  }
  else {
    if (err->error_code != 0) {
      return (HelicsMessage)0x0;
    }
    if ((endpoint == (HelicsEndpoint)0x0) || (*(int *)((long)endpoint + 0x20) != -0x4bac6b3e)) {
      err->error_code = -3;
      err->message = "The given endpoint does not point to a valid object";
      return (HelicsMessage)0x0;
    }
  }
  if (*(long *)((long)endpoint + 8) == 0) {
    return (HelicsMessage)0x0;
  }
  pMVar1 = helics::MessageHolder::newMessage
                     ((MessageHolder *)(*(long *)((long)endpoint + 8) + 0x20));
  return pMVar1;
}

Assistant:

helics::EndpointObject* verifyEndpoint(HelicsEndpoint ept, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    auto* endObj = reinterpret_cast<helics::EndpointObject*>(ept);
    if (endObj == nullptr || endObj->valid != EndpointValidationIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidEndpoint);
        return nullptr;
    }
    return endObj;
}